

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O3

void __thiscall sjtu::TrainManager::delete_train(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *pBVar1;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this_00;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  size_t sVar4;
  pair<unsigned_int,_bool> pVar5;
  invalid_command *this_01;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  char *__s;
  int iVar10;
  pair<long,_bool> pVar11;
  string trainID;
  ulong local_d8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long local_90;
  char local_88;
  ulong local_80;
  long local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = 0;
  iVar10 = 0;
  if (0 < argc) {
    do {
      iVar2 = std::__cxx11::string::compare((char *)argv);
      if (iVar2 != 0) {
        this_01 = (invalid_command *)__cxa_allocate_exception(0x68);
        invalid_command::invalid_command(this_01);
        __cxa_throw(this_01,&invalid_command::typeinfo,invalid_command::~invalid_command);
      }
      std::__cxx11::string::_M_assign((string *)&local_d0);
      argv = argv + 2;
      iVar10 = iVar10 + 2;
    } while (iVar10 < argc);
  }
  pBVar1 = this->TrainBpTree;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_d0,local_d0 + local_c8);
  if (local_48 == 0) {
    local_d8 = 0;
  }
  else {
    lVar8 = 0;
    lVar6 = 0;
    local_d8 = 0;
    do {
      lVar6 = ((long)*(char *)((long)local_50 + lVar8) + lVar6 * 0x239 + 0x100) % 0x3b800001;
      local_d8 = (long)((long)*(char *)((long)local_50 + lVar8) + local_d8 * 0x301 + 0x100) %
                 0x3b9aca07;
      lVar8 = lVar8 + 1;
    } while (local_48 != lVar8);
    local_d8 = lVar6 << 0x20 | local_d8;
  }
  pVar11 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar1,&local_d8);
  local_88 = pVar11.second;
  local_90 = pVar11.first;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_88 == '\0') {
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    iVar10 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2])
                       (this->TrainFile,&local_90);
    lVar6 = CONCAT44(extraout_var,iVar10);
    if (*(char *)(lVar6 + 0xa799) == '\x01') {
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    }
    else {
      if (0 < *(int *)(lVar6 + 0x18)) {
        local_80 = (ulong)((int)(*(ulong *)(lVar6 + 0xa7a0) / 0xa7a8) - 1);
        local_78 = lVar6 + 0x20;
        lVar8 = 0;
        do {
          this_00 = this->StationBpTree;
          __s = (char *)(lVar8 * 0x1a8 + local_78);
          local_b0 = local_a0;
          sVar4 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,__s + sVar4);
          if (local_a8 == 0) {
            local_d8 = 0;
          }
          else {
            lVar9 = 0;
            lVar7 = 0;
            local_d8 = 0;
            do {
              lVar7 = ((long)*(char *)((long)local_b0 + lVar9) + lVar7 * 0x239 + 0x100) % 0x3b800001
              ;
              local_d8 = (long)((long)*(char *)((long)local_b0 + lVar9) + local_d8 * 0x301 + 0x100)
                         % 0x3b9aca07;
              lVar9 = lVar9 + 1;
            } while (local_a8 != lVar9);
            local_d8 = lVar7 << 0x20 | local_d8;
          }
          pVar5 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
                  find(this_00,&local_d8);
          if (local_b0 != local_a0) {
            operator_delete(local_b0,local_a0[0] + 1);
          }
          bitset_set(this,pVar5.first,(uint)local_80,0);
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)(lVar6 + 0x18));
      }
      pBVar1 = this->TrainBpTree;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d0,local_d0 + local_c8);
      if (local_68 == 0) {
        local_d8 = 0;
      }
      else {
        lVar8 = 0;
        lVar6 = 0;
        local_d8 = 0;
        do {
          lVar6 = ((long)*(char *)((long)local_70 + lVar8) + lVar6 * 0x239 + 0x100) % 0x3b800001;
          local_d8 = (long)((long)*(char *)((long)local_70 + lVar8) + local_d8 * 0x301 + 0x100) %
                     0x3b9aca07;
          lVar8 = lVar8 + 1;
        } while (local_68 != lVar8);
        local_d8 = lVar6 << 0x20 | local_d8;
      }
      BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::erase
                (pBVar1,&local_d8);
      DynamicFileManager<sjtu::trainType>::release(this->TrainFile,local_90);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    }
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  return;
}

Assistant:

void delete_train(int argc , std::string *argv)
		{
			std::string trainID;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else
			{
				trainType *train = TrainFile -> read(ret.first);
				if (train -> is_released == true) std::cout << -1 << std::endl;
				else
				{
					for (int i = 0 , train_id = train -> offset / sizeof (DynamicFileManager<trainType>::valueType) - 1;i < train -> stationNum;++ i)
					{
						int id = StationBpTree -> find(hasher(train -> stations[i].stationName)).first;
						bitset_set(id , train_id , 0);
					}
					TrainBpTree -> erase(hasher(trainID)) , TrainFile -> release(ret.first);
					std::cout << 0 << std::endl;
				}
			}
		}